

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O1

void __thiscall helics::CommsInterface::setName(CommsInterface *this,string *commName)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  
  cVar2 = '\0';
  do {
    LOCK();
    cVar1 = (this->operating)._M_base._M_i;
    bVar3 = cVar2 == cVar1;
    if (bVar3) {
      (this->operating)._M_base._M_i = true;
      cVar1 = cVar2;
    }
    cVar2 = cVar1;
    UNLOCK();
    if (bVar3) goto LAB_002ed04c;
  } while ((this->txStatus)._M_i == STARTUP);
  if (bVar3) {
LAB_002ed04c:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->name,commName);
    LOCK();
    if ((this->operating)._M_base._M_i == true) {
      (this->operating)._M_base._M_i = false;
    }
    UNLOCK();
  }
  return;
}

Assistant:

void CommsInterface::setName(const std::string& commName)
{
    if (propertyLock()) {
        name = commName;
        propertyUnLock();
    }
}